

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleformatter.cpp
# Opt level: O0

UnicodeString *
icu_63::SimpleFormatter::format
          (UChar *compiledPattern,int32_t compiledPatternLength,UnicodeString **values,
          UnicodeString *result,UnicodeString *resultCopy,UBool forbidResultAsValue,int32_t *offsets
          ,int32_t offsetsLength,UErrorCode *errorCode)

{
  UnicodeString *this;
  UBool UVar1;
  int32_t iVar2;
  int iVar3;
  ConstChar16Ptr local_60;
  int32_t local_54;
  UnicodeString *pUStack_50;
  int32_t length;
  UnicodeString *value;
  int32_t n;
  int32_t i_1;
  int32_t i;
  UBool forbidResultAsValue_local;
  UnicodeString *resultCopy_local;
  UnicodeString *result_local;
  UnicodeString **values_local;
  UChar *pUStack_18;
  int32_t compiledPatternLength_local;
  UChar *compiledPattern_local;
  
  i_1._3_1_ = forbidResultAsValue;
  _i = resultCopy;
  resultCopy_local = result;
  result_local = (UnicodeString *)values;
  values_local._4_4_ = compiledPatternLength;
  pUStack_18 = compiledPattern;
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    for (n = 0; n < offsetsLength; n = n + 1) {
      offsets[n] = -1;
    }
    value._4_4_ = 1;
    while (this = resultCopy_local, value._4_4_ < values_local._4_4_) {
      iVar3 = value._4_4_ + 1;
      value._0_4_ = (uint)(ushort)pUStack_18[value._4_4_];
      value._4_4_ = iVar3;
      if ((uint)value < 0x100) {
        pUStack_50 = (UnicodeString *)
                     (&result_local->super_Replaceable)[(int)(uint)value].super_UObject.
                     _vptr_UObject;
        if (pUStack_50 == (UnicodeString *)0x0) {
          *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
          return resultCopy_local;
        }
        if (pUStack_50 == resultCopy_local) {
          if (i_1._3_1_ != '\0') {
            *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
            return resultCopy_local;
          }
          if (iVar3 == 2) {
            if ((int)(uint)value < offsetsLength) {
              offsets[(int)(uint)value] = 0;
            }
          }
          else {
            if ((int)(uint)value < offsetsLength) {
              iVar2 = UnicodeString::length(resultCopy_local);
              offsets[(int)(uint)value] = iVar2;
            }
            UnicodeString::append(resultCopy_local,_i);
          }
        }
        else {
          if ((int)(uint)value < offsetsLength) {
            iVar2 = UnicodeString::length(resultCopy_local);
            offsets[(int)(uint)value] = iVar2;
          }
          UnicodeString::append(resultCopy_local,pUStack_50);
        }
      }
      else {
        local_54 = (uint)value - 0x100;
        ConstChar16Ptr::ConstChar16Ptr(&local_60,pUStack_18 + iVar3);
        UnicodeString::append(this,&local_60,local_54);
        ConstChar16Ptr::~ConstChar16Ptr(&local_60);
        value._4_4_ = local_54 + value._4_4_;
      }
    }
    compiledPattern_local = (UChar *)resultCopy_local;
  }
  else {
    compiledPattern_local = (UChar *)resultCopy_local;
  }
  return (UnicodeString *)compiledPattern_local;
}

Assistant:

UnicodeString &SimpleFormatter::format(
        const UChar *compiledPattern, int32_t compiledPatternLength,
        const UnicodeString *const *values,
        UnicodeString &result, const UnicodeString *resultCopy, UBool forbidResultAsValue,
        int32_t *offsets, int32_t offsetsLength,
        UErrorCode &errorCode) {
    if (U_FAILURE(errorCode)) {
        return result;
    }
    for (int32_t i = 0; i < offsetsLength; i++) {
        offsets[i] = -1;
    }
    for (int32_t i = 1; i < compiledPatternLength;) {
        int32_t n = compiledPattern[i++];
        if (n < ARG_NUM_LIMIT) {
            const UnicodeString *value = values[n];
            if (value == NULL) {
                errorCode = U_ILLEGAL_ARGUMENT_ERROR;
                return result;
            }
            if (value == &result) {
                if (forbidResultAsValue) {
                    errorCode = U_ILLEGAL_ARGUMENT_ERROR;
                    return result;
                }
                if (i == 2) {
                    // We are appending to result which is also the first value object.
                    if (n < offsetsLength) {
                        offsets[n] = 0;
                    }
                } else {
                    if (n < offsetsLength) {
                        offsets[n] = result.length();
                    }
                    result.append(*resultCopy);
                }
            } else {
                if (n < offsetsLength) {
                    offsets[n] = result.length();
                }
                result.append(*value);
            }
        } else {
            int32_t length = n - ARG_NUM_LIMIT;
            result.append(compiledPattern + i, length);
            i += length;
        }
    }
    return result;
}